

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O3

void proxy_conn_finish(proxy_conn_handle *pc)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)pc->priv;
  proxy_conn_drop(pc);
  conn_close((conn_handle *)(puVar1 + 1));
  conn_close((conn_handle *)(puVar1 + 5));
  conn_close((conn_handle *)(puVar1 + 9));
  worker_wait_idle((worker_handle *)(puVar1 + 0x17));
  worker_wait_idle((worker_handle *)(puVar1 + 0x13));
  worker_wait_idle((worker_handle *)(puVar1 + 0xf));
  mutex_lock((mutex_handle *)(puVar1 + 0xd));
  *puVar1 = 0;
  mutex_unlock((mutex_handle *)(puVar1 + 0xd));
  return;
}

Assistant:

void proxy_conn_finish(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;

	proxy_conn_drop(pc);

	conn_close(&priv->conn_control);
	conn_close(&priv->conn_data);
	conn_close(&priv->conn_tcp);

	worker_wait_idle(&priv->worker_tcp);
	worker_wait_idle(&priv->worker_data);
	worker_wait_idle(&priv->worker_control);

	mutex_lock(&priv->mutex_client);

	priv->conn_client = NULL;

	mutex_unlock(&priv->mutex_client);
}